

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O3

string * __thiscall
duckdb::BindContext::AmbiguityException_abi_cxx11_
          (string *__return_storage_ptr__,BindContext *this,BindingAlias *alias,
          vector<std::reference_wrapper<duckdb::Binding>,_true> *bindings)

{
  bool bVar1;
  const_reference pvVar2;
  BindingAlias *pBVar3;
  long *plVar4;
  BindingAlias *other;
  long *plVar5;
  size_type *psVar6;
  size_type __n;
  byte bVar7;
  size_type __n_00;
  BindingAlias *this_00;
  string new_minimum_alias;
  string minimum_alias;
  string local_c0;
  undefined1 *local_a0;
  ulong local_98;
  undefined1 local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  BindContext *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  local_80 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_80;
  local_78 = this;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"(use: ","");
  if ((pointer)(alias->catalog)._M_string_length != (alias->catalog)._M_dataplus._M_p) {
    __n_00 = 0;
    do {
      if (__n_00 != 0) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      pvVar2 = vector<std::reference_wrapper<duckdb::Binding>,_true>::operator[]
                         ((vector<std::reference_wrapper<duckdb::Binding>,_true> *)alias,__n_00);
      local_a0 = local_90;
      local_98 = 0;
      local_90[0] = 0;
      pBVar3 = (BindingAlias *)(alias->catalog)._M_dataplus._M_p;
      other = (BindingAlias *)(alias->catalog)._M_string_length;
      if (other == pBVar3) {
LAB_00e1b0f0:
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0);
      }
      else {
        this_00 = &pvVar2->_M_data->alias;
        __n = 0;
        bVar7 = 0;
        do {
          if (__n_00 != __n) {
            pvVar2 = vector<std::reference_wrapper<duckdb::Binding>,_true>::operator[]
                               ((vector<std::reference_wrapper<duckdb::Binding>,_true> *)alias,__n);
            pBVar3 = &pvVar2->_M_data->alias;
            bVar1 = BindingAlias::operator==(this_00,pBVar3);
            MinimumUniqueAlias_abi_cxx11_(&local_c0,(duckdb *)this_00,pBVar3,other);
            if (local_98 < local_c0._M_string_length) {
              ::std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_c0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p);
            }
            bVar7 = bVar7 | bVar1;
            pBVar3 = (BindingAlias *)(alias->catalog)._M_dataplus._M_p;
            other = (BindingAlias *)(alias->catalog)._M_string_length;
          }
          __n = __n + 1;
        } while (__n < (ulong)((long)other - (long)pBVar3 >> 3));
        if (bVar7 == 0) goto LAB_00e1b0f0;
        BindingAlias::ToString_abi_cxx11_(&local_50,(BindingAlias *)local_78);
        plVar4 = (long *)::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1d918ea);
        plVar5 = plVar4 + 2;
        if ((long *)*plVar4 == plVar5) {
          local_60 = *plVar5;
          lStack_58 = plVar4[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar5;
          local_70 = (long *)*plVar4;
        }
        local_68 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)::std::__cxx11::string::append((char *)&local_70);
        psVar6 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_c0.field_2._M_allocated_capacity = *psVar6;
          local_c0.field_2._8_8_ = plVar4[3];
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar6;
          local_c0._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_c0._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        if (local_70 != &local_60) {
          operator_delete(local_70);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      if (local_a0 != local_90) {
        operator_delete(local_a0);
      }
      __n_00 = __n_00 + 1;
    } while (__n_00 < (ulong)((long)((alias->catalog)._M_string_length -
                                    (long)(alias->catalog)._M_dataplus._M_p) >> 3));
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string BindContext::AmbiguityException(const BindingAlias &alias, const vector<reference<Binding>> &bindings) {
	D_ASSERT(bindings.size() > 1);
	// found multiple matching aliases
	string result = "(use: ";
	for (idx_t i = 0; i < bindings.size(); i++) {
		if (i > 0) {
			if (i + 1 == bindings.size()) {
				result += " or ";
			} else {
				result += ", ";
			}
		}
		// find the minimum alias that uniquely describes this table reference
		auto &current_alias = bindings[i].get().alias;
		string minimum_alias;
		bool duplicate_alias = false;
		for (idx_t k = 0; k < bindings.size(); k++) {
			if (k == i) {
				continue;
			}
			auto &other_alias = bindings[k].get().alias;
			if (current_alias == other_alias) {
				duplicate_alias = true;
			}
			string new_minimum_alias = MinimumUniqueAlias(current_alias, other_alias);
			if (new_minimum_alias.size() > minimum_alias.size()) {
				minimum_alias = std::move(new_minimum_alias);
			}
		}
		if (duplicate_alias) {
			result = "(duplicate alias \"" + alias.ToString() +
			         "\", explicitly alias one of the tables using \"AS my_alias\"";
		} else {
			result += minimum_alias;
		}
	}
	result += ")";
	return result;
}